

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O1

void __thiscall
ExprVisitorTest_InvalidExpr_Test::~ExprVisitorTest_InvalidExpr_Test
          (ExprVisitorTest_InvalidExpr_Test *this)

{
  (this->super_ExprVisitorTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprVisitorTest_001e1f98
  ;
  testing::StrictMock<MockVisitor>::~StrictMock(&(this->super_ExprVisitorTest).visitor_);
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory
            (&(this->super_ExprVisitorTest).factory_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x1cd0);
  return;
}

Assistant:

TEST_F(ExprVisitorTest, InvalidExpr) {
  using ::testing::_;
  typedef AllocatorRef< ::testing::NiceMock<MockAllocator> > Allocator;
  ::testing::NiceMock<MockAllocator> alloc;
  char buffer[100];
  mp::BasicExprFactory<Allocator> f((Allocator(&alloc)));

  // Corrupt a numeric expression and check if visiting it results in
  // assertion failure.
  EXPECT_CALL(alloc, allocate(_)).WillOnce(::testing::Return(buffer));
  auto e1 = f.MakeNumericConstant(0);
  std::fill(buffer, buffer + sizeof(buffer), 0);
  EXPECT_ASSERT(visitor_.Visit(e1), "invalid expression");

  // Corrupt a logical expression and check if visiting it results in
  // assertion failure.
  EXPECT_CALL(alloc, allocate(_)).WillOnce(::testing::Return(buffer));
  auto e2 = f.MakeLogicalConstant(false);
  std::fill(buffer, buffer + sizeof(buffer), 0);
  EXPECT_ASSERT(visitor_.Visit(e2), "invalid expression");
}